

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O2

Vector<double,_3> * __thiscall
tcu::reflect<double,3>
          (Vector<double,_3> *__return_storage_ptr__,tcu *this,Vector<double,_3> *i,
          Vector<double,_3> *n)

{
  double dVar1;
  Vector<double,_3> VStack_38;
  
  dVar1 = dot<double,3>(i,(Vector<double,_3> *)this);
  operator*(&VStack_38,dVar1 + dVar1,i);
  operator-(__return_storage_ptr__,(Vector<double,_3> *)this,&VStack_38);
  return __return_storage_ptr__;
}

Assistant:

inline Vector<T, Size> reflect (const Vector<T, Size>& i, const Vector<T, Size>& n)
{
	return i - T(2) * dot(n, i) * n;
}